

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *pSVar10;
  PropertyRecord **ppPVar11;
  PropertyRecord *pPVar12;
  UndeclaredBlockVariable *pUVar13;
  PropertyRecord *pPVar14;
  int local_50;
  uint local_4c;
  int propertyIndex;
  DynamicObject *local_40;
  PropertyOperationFlags local_38;
  uint local_34;
  
  local_38 = flags;
  local_4c = propertyId;
  local_34 = propertyKey;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    local_40 = instance;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar4) goto LAB_00e2c708;
    *puVar9 = 0;
    instance = local_40;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  _propertyIndex =
       (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar5 = descriptor->Attributes;
  if ((bVar5 & 8) == 0) {
    if ((local_38 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar5 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_38,_propertyIndex);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar10 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *
                           )this,instance);
      iVar7 = (*(pSVar10->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                        (pSVar10,instance,(ulong)local_34,value,(ulong)local_38,info);
      return iVar7;
    }
    local_40 = instance;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00e2c708;
        *puVar9 = 0;
      }
      DynamicObject::ChangeType(local_40);
    }
    if (((local_38 & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                          ((DynamicTypeHandler *)this,_propertyIndex,
                           (local_38 &
                           (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
                           PropertyOperation_None), !bVar4)) {
      return 0;
    }
    instance = local_40;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>
                                     *)this,local_40,descriptor->propertyIndex,&local_50), bVar4)) {
      ppPVar11 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),local_50);
      pPVar14 = *ppPVar11;
      pPVar12 = ScriptContext::GetPropertyName(_propertyIndex,local_34);
      if (pPVar14 != pPVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar4) goto LAB_00e2c708;
        *puVar9 = 0;
      }
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),local_50);
    }
    bVar4 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                       this,_propertyIndex);
    if (bVar4) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>)
                   ((char)this[0x29] + -1);
    }
    descriptor->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    uVar3 = local_34;
    if (local_34 != 0xffffffff) {
      ScriptContext::InvalidateProtoCaches(_propertyIndex,local_34);
    }
    descriptor->Attributes = '\a';
    bVar5 = 7;
    local_4c = uVar3;
  }
  if (descriptor->propertyIndex == -1) goto LAB_00e2c683;
  if (((-1 < (char)local_38 && 0x3f < bVar5) &&
      (pUVar13 = (UndeclaredBlockVariable *)
                 DynamicObject::GetSlot(instance,descriptor->propertyIndex),
      (local_38 >> 8 & 1) == 0)) &&
     ((((_propertyIndex->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      pUVar13)) {
    JavascriptError::ThrowReferenceError(_propertyIndex,-0x7ff5ec07,(PCWSTR)0x0);
  }
  if (*(long **)(this + 0x20) == (long *)0x0) {
    bVar4 = false;
  }
  else if ((DynamicObject *)**(long **)(this + 0x20) == instance) {
    bVar4 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar4) goto LAB_00e2c708;
    *puVar9 = 0;
    bVar4 = false;
  }
  if ((*(byte *)descriptor & 2) == 0) {
    if ((((local_38 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)descriptor = *(byte *)descriptor | 2, bVar4)) &&
       ((local_38 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_34)) {
      local_40 = instance;
      if (((byte)this[9] & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar4) goto LAB_00e2c708;
        *puVar9 = 0;
      }
      if (value == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar4) goto LAB_00e2c708;
        *puVar9 = 0;
      }
      instance = local_40;
      BVar8 = RecyclableObject::IsExternal(&local_40->super_RecyclableObject);
      if (BVar8 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar4) {
LAB_00e2c708:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
        instance = local_40;
      }
      bVar4 = VarIs<Js::JavascriptFunction>(value);
      if (bVar4) {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar5 = *(byte *)descriptor;
        if (bVar4) goto LAB_00e2c6f9;
LAB_00e2c6f5:
        bVar6 = 4;
      }
      else {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar4) {
          bVar5 = *(byte *)descriptor;
        }
        else {
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_4c,value);
          bVar5 = *(byte *)descriptor;
          if (bVar4) goto LAB_00e2c6f5;
        }
LAB_00e2c6f9:
        bVar6 = 0;
      }
      *(byte *)descriptor = bVar5 & 0xfb | bVar6;
    }
  }
  else {
    pPVar14 = ScriptContext::GetPropertyName(_propertyIndex,local_34);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar14,descriptor,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,value);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00e2c683:
  uVar3 = local_34;
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(local_4c,local_34);
  if (uVar3 != 0xffffffff) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,uVar3,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }